

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O2

void __thiscall
GslSpan_FromContainerConstructor_Test::TestBody(GslSpan_FromContainerConstructor_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  span<int,__1L> sVar2;
  span<const_int,__1L> sVar3;
  initializer_list<int> __l;
  AssertionResult gtest_ar_2;
  AssertHelper local_88;
  span<const_int,__1L> cs;
  AssertHelper local_70;
  span<int,__1L> s;
  vector<int,_std::allocator<int>_> v;
  vector<int,_std::allocator<int>_> cv;
  span<const_int,__1L> local_18;
  
  cv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_200000001;
  cv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish._0_4_ =
       3;
  __l._M_len = 3;
  __l._M_array = (iterator)&cv;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&s);
  std::vector<int,_std::allocator<int>_>::vector(&cv,&v);
  pstore::gsl::span<int,_-1L>::span<int>(&s,&v);
  gtest_ar_2._0_8_ = s.storage_.super_extent_type<_1L>.size_;
  local_88.data_ =
       (AssertHelperData *)
       ((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start >> 2);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&cs,"s.size ()","static_cast<std::ptrdiff_t> (v.size ())",
             (long *)&gtest_ar_2,(long *)&local_88);
  if ((char)cs.storage_.super_extent_type<_1L>.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (cs.storage_.data_ == (pointer)0x0) {
      pcVar1 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar1 = *(char **)cs.storage_.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x266,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (gtest_ar_2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cs.storage_.data_);
  gtest_ar_2._0_8_ = s.storage_.data_;
  local_88.data_ =
       (AssertHelperData *)
       v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  testing::internal::CmpHelperEQ<int*,int*>
            ((internal *)&cs,"s.data ()","v.data ()",(int **)&gtest_ar_2,(int **)&local_88);
  if ((char)cs.storage_.super_extent_type<_1L>.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (cs.storage_.data_ == (pointer)0x0) {
      pcVar1 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar1 = *(char **)cs.storage_.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x267,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (gtest_ar_2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cs.storage_.data_);
  pstore::gsl::span<const_int,_-1L>::span<int>(&cs,&v);
  local_88.data_ = (AssertHelperData *)cs.storage_.super_extent_type<_1L>.size_;
  local_70.data_ =
       (AssertHelperData *)
       ((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start >> 2);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar_2,"cs.size ()","static_cast<std::ptrdiff_t> (v.size ())",
             (long *)&local_88,(long *)&local_70);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x26a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  local_88.data_ = (AssertHelperData *)cs.storage_.data_;
  local_70.data_ =
       (AssertHelperData *)
       v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  testing::internal::CmpHelperEQ<int_const*,int*>
            ((internal *)&gtest_ar_2,"cs.data ()","v.data ()",(int **)&local_88,(int **)&local_70);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x26b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  s.storage_.super_extent_type<_1L>.size_ = 0;
  s.storage_.data_ = (pointer)0x0;
  pstore::gsl::span<const_int,_-1L>::span<int>(&local_18,(vector<int,_std::allocator<int>_> *)&s);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&s);
  sVar2 = pstore::gsl::make_span<std::vector<int,std::allocator<int>>>(&v);
  cs.storage_.super_extent_type<_1L> = sVar2.storage_.super_extent_type<_1L>.size_;
  gtest_ar_2._0_8_ =
       (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&s,"s.size ()","static_cast<std::ptrdiff_t> (v.size ())",(long *)&cs,
             (long *)&gtest_ar_2);
  if ((char)s.storage_.super_extent_type<_1L>.size_ == '\0') {
    testing::Message::Message((Message *)&cs);
    if (s.storage_.data_ == (pointer)0x0) {
      pcVar1 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar1 = *(char **)s.storage_.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2b2,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&cs);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if (cs.storage_.super_extent_type<_1L>.size_ != 0) {
      (**(code **)(*(long *)cs.storage_.super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&s.storage_.data_);
  gtest_ar_2._0_8_ =
       v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  cs.storage_.super_extent_type<_1L>.size_ = (index_type)sVar2.storage_.data_;
  testing::internal::CmpHelperEQ<int*,int*>
            ((internal *)&s,"s.data ()","v.data ()",(int **)&cs,(int **)&gtest_ar_2);
  if ((char)s.storage_.super_extent_type<_1L>.size_ == '\0') {
    testing::Message::Message((Message *)&cs);
    if (s.storage_.data_ == (pointer)0x0) {
      pcVar1 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar1 = *(char **)s.storage_.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2b3,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&cs);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if (cs.storage_.super_extent_type<_1L>.size_ != 0) {
      (**(code **)(*(long *)cs.storage_.super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&s.storage_.data_);
  sVar3 = pstore::gsl::make_span<std::vector<int,std::allocator<int>>>(&cv);
  cs.storage_.super_extent_type<_1L> = sVar3.storage_.super_extent_type<_1L>.size_;
  gtest_ar_2._0_8_ =
       CONCAT44(cv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish._4_4_,
                cv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish._0_4_) -
       (long)cv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&s,"cs.size ()","static_cast<std::ptrdiff_t> (cv.size ())",(long *)&cs,
             (long *)&gtest_ar_2);
  if ((char)s.storage_.super_extent_type<_1L>.size_ == '\0') {
    testing::Message::Message((Message *)&cs);
    if (s.storage_.data_ == (pointer)0x0) {
      pcVar1 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar1 = *(char **)s.storage_.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2b6,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&cs);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if (cs.storage_.super_extent_type<_1L>.size_ != 0) {
      (**(code **)(*(long *)cs.storage_.super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&s.storage_.data_);
  gtest_ar_2._0_8_ =
       cv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  cs.storage_.super_extent_type<_1L>.size_ = (index_type)sVar3.storage_.data_;
  testing::internal::CmpHelperEQ<int_const*,int_const*>
            ((internal *)&s,"cs.data ()","cv.data ()",(int **)&cs,(int **)&gtest_ar_2);
  if ((char)s.storage_.super_extent_type<_1L>.size_ == '\0') {
    testing::Message::Message((Message *)&cs);
    if (s.storage_.data_ == (pointer)0x0) {
      pcVar1 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar1 = *(char **)s.storage_.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2b7,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&cs);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if (cs.storage_.super_extent_type<_1L>.size_ != 0) {
      (**(code **)(*(long *)cs.storage_.super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&s.storage_.data_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&cv.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST (GslSpan, FromContainerConstructor) {
    std::vector<int> v = {1, 2, 3};
    std::vector<int> const cv = v;

    {
        span<int> s{v};
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (v.size ()));
        EXPECT_EQ (s.data (), v.data ());

        span<const int> cs{v};
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (v.size ()));
        EXPECT_EQ (cs.data (), v.data ());
    }

#if 0
    std::string str = "hello";
    std::string const cstr = "hello";

    {
#    ifdef CONFIRM_COMPILATION_ERRORS
        span<char> s{str};
        EXPECT_EQ (s.size() == narrow_cast<std::ptrdiff_t>(str.size()) && s.data(), str.data());
#    endif
        span<char const > cs{str};
        EXPECT_EQ (cs.size(), static_cast<std::ptrdiff_t>(str.size()));
        EXPECT_EQ (cs.data(), str.data());
    }
    {
#    ifdef CONFIRM_COMPILATION_ERRORS
        span<char> s{cstr};
#    endif
        span<const char> cs{cstr};
        EXPECT_EQ (cs.size(), static_cast<std::ptrdiff_t>(cstr.size()));
        EXPECT_EQ (cs.data(), cstr.data());
    }
#endif
    {
#ifdef CONFIRM_COMPILATION_ERRORS
        auto get_temp_vector = [] () -> std::vector<int> { return {}; };
        auto use_span = [] (span<int> s) { static_cast<void> (s); };
        use_span (get_temp_vector ());
#endif
    }
    {
        auto get_temp_vector = [] () -> std::vector<int> { return {}; };
        auto use_span = [] (span<int const> s) { static_cast<void> (s); };
        use_span (span<int const> (get_temp_vector ()));
    }
    {
#ifdef CONFIRM_COMPILATION_ERRORS
        auto get_temp_string = [] () -> std::string { return {}; };
        auto use_span = [] (span<char> s) { static_cast<void> (s); };
        use_span (get_temp_string ());
#endif
    }
#if 0
    {
        auto get_temp_string = []() -> std::string { return {}; };
        auto use_span = [](span<char const> s) { static_cast<void>(s); };
        use_span(get_temp_string());
    }
    {
#    ifdef CONFIRM_COMPILATION_ERRORS
        auto get_temp_vector = []() -> const std::vector<int> { return {}; };
        auto use_span = [](span<const char> s) { static_cast<void>(s); };
        use_span(get_temp_vector());
#    endif
    }
    {
        auto get_temp_string = []() -> std::string const { return {}; };
        auto use_span = [](span<char const> s) { static_cast<void>(s); };
        use_span(get_temp_string());
    }
#endif
    {
#ifdef CONFIRM_COMPILATION_ERRORS
        std::map<int, int> m;
        span<int> s{m};
#endif
    }
    {
        auto s = make_span (v);
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (v.size ()));
        EXPECT_EQ (s.data (), v.data ());

        auto cs = make_span (cv);
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (cv.size ()));
        EXPECT_EQ (cs.data (), cv.data ());
    }
}